

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O2

double __thiscall r_exec::Group::update_act_thr(Group *this)

{
  double dVar1;
  int iVar2;
  undefined4 extraout_var;
  float fVar3;
  double dVar4;
  Atom local_c [4];
  
  if (this->act_thr_changes != 0) {
    fVar3 = get_act_thr(this);
    dVar1 = this->acc_act_thr /
            (((double)CONCAT44(0x45300000,(int)(this->act_thr_changes >> 0x20)) -
             1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)this->act_thr_changes) - 4503599627370496.0)) +
            (double)fVar3;
    dVar4 = 0.0;
    if ((0.0 <= dVar1) && (dVar4 = dVar1, 1.0 < dVar1)) {
      dVar4 = 1.0;
    }
    r_code::Atom::Float((float)dVar4);
    iVar2 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
              super_Code.super__Object._vptr__Object[4])(this,3);
    r_code::Atom::operator=((Atom *)CONCAT44(extraout_var,iVar2),local_c);
    r_code::Atom::~Atom(local_c);
  }
  this->act_thr_changes = 0;
  this->acc_act_thr = 0.0;
  fVar3 = get_act_thr(this);
  return (double)fVar3;
}

Assistant:

double Group::update_act_thr()
{
    if (act_thr_changes) {
        double new_act_thr = get_act_thr() + acc_act_thr / act_thr_changes;

        if (new_act_thr < 0) {
            new_act_thr = 0;
        } else if (new_act_thr > 1) {
            new_act_thr = 1;
        }

        code(GRP_ACT_THR) = r_code::Atom::Float(new_act_thr);
    }

    acc_act_thr = 0;
    act_thr_changes = 0;
    return get_act_thr();
}